

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O3

bool __thiscall cmCTestGIT::LoadRevisions(cmCTestGIT *this)

{
  pointer pcVar1;
  long *plVar2;
  ostream *poVar3;
  cmsysProcess *cp;
  long *plVar4;
  char **extraout_RDX;
  char **cmd;
  char **cmd_00;
  string range;
  OutputLogger err;
  char *git_diff_tree [9];
  CommitParser out;
  char *git_rev_list [6];
  long *local_298;
  long local_288;
  long lStack_280;
  undefined1 local_278 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  undefined1 local_238 [48];
  char *local_208;
  char *local_200;
  size_type local_1f8;
  undefined **local_1f0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_> local_1b0 [2];
  _Alloc_hider local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  Revision local_158;
  _func_int **local_58;
  char *local_50;
  char *local_48;
  _Alloc_hider local_40;
  char *local_38;
  undefined8 local_30;
  
  pcVar1 = (this->super_cmCTestGlobalVC).OldRevision._M_dataplus._M_p;
  local_1f0[0] = (undefined **)&local_1e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f0,pcVar1,
             pcVar1 + (this->super_cmCTestGlobalVC).OldRevision._M_string_length);
  std::__cxx11::string::append((char *)local_1f0);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_1f0,
                              (ulong)(this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_288 = *plVar4;
    lStack_280 = plVar2[3];
    local_298 = &local_288;
  }
  else {
    local_288 = *plVar4;
    local_298 = (long *)*plVar2;
  }
  cmd = (char **)plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0[0] != &local_1e0) {
    operator_delete(local_1f0[0],local_1e0._M_allocated_capacity + 1);
    cmd = extraout_RDX;
  }
  local_238._0_8_ = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  local_50 = "rev-list";
  local_48 = "--reverse";
  local_40._M_p = (pointer)local_298;
  local_38 = "--";
  local_30 = 0;
  local_238._8_8_ = "diff-tree";
  local_238._16_8_ = "--stdin";
  local_238._24_8_ = "--always";
  local_238._32_8_ = "-z";
  local_238._40_8_ = "-r";
  local_208 = "--pretty=raw";
  local_200 = "--encoding=utf-8";
  local_1f8 = 0;
  poVar3 = (this->super_cmCTestGlobalVC).super_cmCTestVC.Log;
  local_58 = (_func_int **)local_238._0_8_;
  cmCTestVC::ComputeCommandLine_abi_cxx11_
            ((string *)local_1f0,(cmCTestVC *)&stack0xffffffffffffffa8,cmd);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)local_1f0[0],(long)local_1f0[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," | ",3);
  cmCTestVC::ComputeCommandLine_abi_cxx11_((string *)local_278,(cmCTestVC *)local_238,cmd_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,(char *)local_278._0_8_,local_278._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
  if ((undefined1 *)local_278._0_8_ != local_278 + 0x10) {
    operator_delete((void *)local_278._0_8_,local_278._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0[0] != &local_1e0) {
    operator_delete(local_1f0[0],local_1e0._M_allocated_capacity + 1);
  }
  cp = cmsysProcess_New();
  cmsysProcess_AddCommand(cp,(char **)&stack0xffffffffffffffa8);
  cmsysProcess_AddCommand(cp,(char **)local_238);
  cmsysProcess_SetWorkingDirectory
            (cp,(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory._M_dataplus._M_p);
  CommitParser::CommitParser((CommitParser *)local_1f0,this,"dt-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_278,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"dt-err> ")
  ;
  cmProcessTools::RunProcess(cp,(OutputParser *)local_1f0,(OutputParser *)local_278,UTF8);
  (*(code *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((long)local_1f0[0] + 0x10))->_M_allocated_capacity)(local_1f0,"",1);
  cmsysProcess_Delete(cp);
  local_278._0_8_ = &PTR__LineParser_0070fd10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._24_8_ != &local_250) {
    operator_delete((void *)local_278._24_8_,local_250._M_allocated_capacity + 1);
  }
  local_1f0[0] = &PTR__CommitParser_0070e0f8;
  cmCTestVC::Revision::~Revision(&local_158);
  local_1f0[0] = &PTR__DiffParser_0070e158;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._M_p != &local_170) {
    operator_delete(local_180._M_p,local_170._M_allocated_capacity + 1);
  }
  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::~vector(local_1b0)
  ;
  local_1f0[0] = &PTR__LineParser_0070fd10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._8_8_ != &local_1c8) {
    operator_delete((void *)local_1e0._8_8_,local_1c8._0_8_ + 1);
  }
  if (local_298 != &local_288) {
    operator_delete(local_298,local_288 + 1);
  }
  return true;
}

Assistant:

bool cmCTestGIT::LoadRevisions()
{
  // Use 'git rev-list ... | git diff-tree ...' to get revisions.
  std::string range = this->OldRevision + ".." + this->NewRevision;
  const char* git = this->CommandLineTool.c_str();
  const char* git_rev_list[] = { git,           "rev-list", "--reverse",
                                 range.c_str(), "--",       nullptr };
  const char* git_diff_tree[] = {
    git,  "diff-tree",    "--stdin",          "--always", "-z",
    "-r", "--pretty=raw", "--encoding=utf-8", nullptr
  };
  this->Log << cmCTestGIT::ComputeCommandLine(git_rev_list) << " | "
            << cmCTestGIT::ComputeCommandLine(git_diff_tree) << "\n";

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_AddCommand(cp, git_rev_list);
  cmsysProcess_AddCommand(cp, git_diff_tree);
  cmsysProcess_SetWorkingDirectory(cp, this->SourceDirectory.c_str());

  CommitParser out(this, "dt-out> ");
  OutputLogger err(this->Log, "dt-err> ");
  cmCTestGIT::RunProcess(cp, &out, &err, cmProcessOutput::UTF8);

  // Send one extra zero-byte to terminate the last record.
  out.Process("", 1);

  cmsysProcess_Delete(cp);
  return true;
}